

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buflist.c
# Opt level: O0

int lws_buflist_fragment_use
              (lws_buflist **head,uint8_t *buf,size_t len,char *frag_first,char *frag_fin)

{
  size_t local_48;
  size_t s;
  uint8_t *obuf;
  char *frag_fin_local;
  char *frag_first_local;
  size_t len_local;
  uint8_t *buf_local;
  lws_buflist **head_local;
  
  if (*head == (lws_buflist *)0x0) {
    head_local._4_4_ = 0;
  }
  else {
    local_48 = (*head)->len - (*head)->pos;
    if (len < local_48) {
      local_48 = len;
    }
    if (frag_first != (char *)0x0) {
      *frag_first = ((*head)->pos != 0 ^ 0xffU) & 1;
    }
    if (frag_fin != (char *)0x0) {
      *frag_fin = (*head)->pos + local_48 == (*head)->len;
    }
    memcpy(buf,(void *)((long)&(*head)[1].pos + (*head)->pos),local_48);
    head_local._4_4_ = (int)local_48;
    lws_buflist_use_segment(head,local_48);
  }
  return head_local._4_4_;
}

Assistant:

int
lws_buflist_fragment_use(struct lws_buflist **head, uint8_t *buf,
			 size_t len, char *frag_first, char *frag_fin)
{
	uint8_t *obuf = buf;
	size_t s;

	if (!*head)
		return 0;

	s = (*head)->len - (*head)->pos;
	if (s > len)
		s = len;

	if (frag_first)
		*frag_first = !(*head)->pos;

	if (frag_fin)
		*frag_fin = (*head)->pos + s == (*head)->len;

	memcpy(buf, ((uint8_t *)((*head) + 1)) + LWS_PRE + (*head)->pos, s);
	len -= s;
	buf += s;
	lws_buflist_use_segment(head, s);

	return lws_ptr_diff(buf, obuf);
}